

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Check.cpp
# Opt level: O2

void __thiscall Check::~Check(Check *this)

{
  ~Check(this);
  operator_delete(this);
  return;
}

Assistant:

Check::~Check() {

}